

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlDtdPtr xmlCopyDtd(xmlDtdPtr dtd)

{
  int iVar1;
  xmlNodePtr node;
  xmlDtdPtr dtd_00;
  xmlEntitiesTablePtr pxVar2;
  xmlNotationTablePtr pxVar3;
  xmlElementTablePtr pxVar4;
  xmlAttributeTablePtr pxVar5;
  xmlAttributePtr pxVar6;
  _xmlNode **pp_Var7;
  xmlElementPtr tmp;
  xmlHashTablePtr hash;
  xmlAttributePtr pxVar8;
  
  if (dtd == (xmlDtdPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  dtd_00 = xmlNewDtd((xmlDocPtr)0x0,dtd->name,dtd->ExternalID,dtd->SystemID);
  if (dtd_00 == (xmlDtdPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  if ((xmlEntitiesTablePtr)dtd->entities != (xmlEntitiesTablePtr)0x0) {
    pxVar2 = xmlCopyEntitiesTable((xmlEntitiesTablePtr)dtd->entities);
    dtd_00->entities = pxVar2;
    if (pxVar2 == (xmlEntitiesTablePtr)0x0) goto LAB_0014911b;
  }
  if ((xmlNotationTablePtr)dtd->notations != (xmlNotationTablePtr)0x0) {
    pxVar3 = xmlCopyNotationTable((xmlNotationTablePtr)dtd->notations);
    dtd_00->notations = pxVar3;
    if (pxVar3 == (xmlNotationTablePtr)0x0) goto LAB_0014911b;
  }
  if ((xmlElementTablePtr)dtd->elements != (xmlElementTablePtr)0x0) {
    pxVar4 = xmlCopyElementTable((xmlElementTablePtr)dtd->elements);
    dtd_00->elements = pxVar4;
    if (pxVar4 == (xmlElementTablePtr)0x0) goto LAB_0014911b;
  }
  if ((xmlAttributeTablePtr)dtd->attributes != (xmlAttributeTablePtr)0x0) {
    pxVar5 = xmlCopyAttributeTable((xmlAttributeTablePtr)dtd->attributes);
    dtd_00->attributes = pxVar5;
    if (pxVar5 == (xmlAttributeTablePtr)0x0) goto LAB_0014911b;
  }
  if ((xmlEntitiesTablePtr)dtd->pentities != (xmlEntitiesTablePtr)0x0) {
    pxVar2 = xmlCopyEntitiesTable((xmlEntitiesTablePtr)dtd->pentities);
    dtd_00->pentities = pxVar2;
    if (pxVar2 == (xmlEntitiesTablePtr)0x0) {
LAB_0014911b:
      xmlFreeDtd(dtd_00);
      return (xmlDtdPtr)0x0;
    }
  }
  pp_Var7 = &dtd->children;
  pxVar8 = (xmlAttributePtr)0x0;
LAB_00149063:
  do {
    node = *pp_Var7;
    if (node == (xmlNodePtr)0x0) {
      return dtd_00;
    }
    switch(node->type) {
    case XML_COMMENT_NODE:
      pxVar6 = (xmlAttributePtr)xmlCopyNode(node,0);
      if (pxVar6 != (xmlAttributePtr)0x0) goto LAB_001490f0;
      goto LAB_0014911b;
    case XML_ELEMENT_DECL:
      pxVar6 = (xmlAttributePtr)xmlGetDtdQElementDesc(dtd_00,node->name,(xmlChar *)node->nsDef);
      goto LAB_001490d6;
    case XML_ATTRIBUTE_DECL:
      pxVar6 = xmlGetDtdQAttrDesc(dtd_00,*(xmlChar **)&node->line,node->name,(xmlChar *)node->psvi);
LAB_001490d6:
      if (pxVar6 != (xmlAttributePtr)0x0) {
LAB_001490f0:
        pp_Var7 = &pxVar8->next;
        if (pxVar8 == (xmlAttributePtr)0x0) {
          pp_Var7 = &dtd_00->children;
        }
        *pp_Var7 = (_xmlNode *)pxVar6;
        pxVar6->prev = (_xmlNode *)pxVar8;
        pxVar6->parent = dtd_00;
        pxVar6->next = (_xmlNode *)0x0;
        dtd_00->last = (_xmlNode *)pxVar6;
        pp_Var7 = &node->next;
        pxVar8 = pxVar6;
        goto LAB_00149063;
      }
      break;
    case XML_ENTITY_DECL:
      iVar1 = *(int *)((long)&node->properties + 4);
      if (iVar1 - 1U < 3) {
        hash = (xmlHashTablePtr)dtd_00->entities;
      }
      else {
        if (1 < iVar1 - 4U) break;
        hash = (xmlHashTablePtr)dtd_00->pentities;
      }
      if (hash != (xmlHashTablePtr)0x0) {
        pxVar6 = (xmlAttributePtr)xmlHashLookup(hash,node->name);
        goto LAB_001490d6;
      }
    }
    pp_Var7 = &node->next;
  } while( true );
}

Assistant:

xmlDtdPtr
xmlCopyDtd(xmlDtdPtr dtd) {
    xmlDtdPtr ret;
    xmlNodePtr cur, p = NULL, q;

    if (dtd == NULL) return(NULL);
    ret = xmlNewDtd(NULL, dtd->name, dtd->ExternalID, dtd->SystemID);
    if (ret == NULL) return(NULL);
    if (dtd->entities != NULL) {
        ret->entities = (void *) xmlCopyEntitiesTable(
	                    (xmlEntitiesTablePtr) dtd->entities);
        if (ret->entities == NULL)
            goto error;
    }
    if (dtd->notations != NULL) {
        ret->notations = (void *) xmlCopyNotationTable(
	                    (xmlNotationTablePtr) dtd->notations);
        if (ret->notations == NULL)
            goto error;
    }
    if (dtd->elements != NULL) {
        ret->elements = (void *) xmlCopyElementTable(
	                    (xmlElementTablePtr) dtd->elements);
        if (ret->elements == NULL)
            goto error;
    }
    if (dtd->attributes != NULL) {
        ret->attributes = (void *) xmlCopyAttributeTable(
	                    (xmlAttributeTablePtr) dtd->attributes);
        if (ret->attributes == NULL)
            goto error;
    }
    if (dtd->pentities != NULL) {
	ret->pentities = (void *) xmlCopyEntitiesTable(
			    (xmlEntitiesTablePtr) dtd->pentities);
        if (ret->pentities == NULL)
            goto error;
    }

    cur = dtd->children;
    while (cur != NULL) {
	q = NULL;

	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr tmp = (xmlEntityPtr) cur;
	    switch (tmp->etype) {
		case XML_INTERNAL_GENERAL_ENTITY:
		case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
		case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
		    q = (xmlNodePtr) xmlGetEntityFromDtd(ret, tmp->name);
		    break;
		case XML_INTERNAL_PARAMETER_ENTITY:
		case XML_EXTERNAL_PARAMETER_ENTITY:
		    q = (xmlNodePtr)
			xmlGetParameterEntityFromDtd(ret, tmp->name);
		    break;
		case XML_INTERNAL_PREDEFINED_ENTITY:
		    break;
	    }
	} else if (cur->type == XML_ELEMENT_DECL) {
	    xmlElementPtr tmp = (xmlElementPtr) cur;
	    q = (xmlNodePtr)
		xmlGetDtdQElementDesc(ret, tmp->name, tmp->prefix);
	} else if (cur->type == XML_ATTRIBUTE_DECL) {
	    xmlAttributePtr tmp = (xmlAttributePtr) cur;
	    q = (xmlNodePtr)
		xmlGetDtdQAttrDesc(ret, tmp->elem, tmp->name, tmp->prefix);
	} else if (cur->type == XML_COMMENT_NODE) {
	    q = xmlCopyNode(cur, 0);
            if (q == NULL)
                goto error;
	}

	if (q == NULL) {
	    cur = cur->next;
	    continue;
	}

	if (p == NULL)
	    ret->children = q;
	else
	    p->next = q;

	q->prev = p;
	q->parent = (xmlNodePtr) ret;
	q->next = NULL;
	ret->last = q;
	p = q;
	cur = cur->next;
    }

    return(ret);

error:
    xmlFreeDtd(ret);
    return(NULL);
}